

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void __thiscall wabt::WastParser::CheckImportOrdering(WastParser *this,Module *module)

{
  Token local_50;
  
  if (((((long)(module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)module->num_func_imports) ||
       ((long)(module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)module->num_table_imports)) ||
      ((long)(module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)module->num_memory_imports)) ||
     (((long)(module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)module->num_global_imports ||
      ((long)(module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)module->num_event_imports)))) {
    GetToken(&local_50,this);
    Error(this,0x1962c8);
  }
  return;
}

Assistant:

Result WastParser::ParseNat(uint64_t* out_nat) {
  WABT_TRACE(ParseNat);
  if (!PeekMatch(TokenType::Nat)) {
    return ErrorExpected({"a natural number"}, "123");
  }

  Token token = Consume();
  string_view sv = token.literal().text;
  if (Failed(ParseUint64(sv.begin(), sv.end(), out_nat))) {
    Error(token.loc, "invalid int \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(sv));
  }

  return Result::Ok;
}